

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable-common.h
# Opt level: O2

size_type __thiscall
google::sparsehash_internal::sh_hashtable_settings<HashObject<4,_4>_*,_HashFn,_unsigned_long,_4>::
min_buckets(sh_hashtable_settings<HashObject<4,_4>_*,_HashFn,_unsigned_long,_4> *this,
           size_type num_elts,size_type min_buckets_wanted)

{
  size_type sVar1;
  length_error *this_00;
  ulong uVar2;
  float fVar3;
  
  sVar1 = 4;
  while ((sVar1 < min_buckets_wanted ||
         (fVar3 = (float)sVar1 * this->enlarge_factor_, uVar2 = (ulong)fVar3,
         ((long)(fVar3 - 9.223372e+18) & (long)uVar2 >> 0x3f | uVar2) <= num_elts))) {
    if ((long)sVar1 < 0) {
      this_00 = (length_error *)__cxa_allocate_exception(0x10);
      std::length_error::length_error(this_00,"resize overflow");
      __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
    }
    sVar1 = sVar1 * 2;
  }
  return sVar1;
}

Assistant:

float enlarge_factor() const { return enlarge_factor_; }